

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextmarkdownimporter.cpp
# Opt level: O3

void __thiscall QTextMarkdownImporter::insertBlock(QTextMarkdownImporter *this)

{
  QStack<QPointer<QTextList>_> *this_00;
  Data *pDVar1;
  long lVar2;
  bool bVar3;
  iterator iVar4;
  iterator iVar5;
  QTextDocument *this_01;
  QChar QVar6;
  undefined8 uVar7;
  QObject *pQVar8;
  long in_FS_OFFSET;
  QString local_90;
  undefined1 local_78 [16];
  undefined1 local_68 [24];
  anon_union_24_3_e3d07ef4_for_data local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextCharFormat::QTextCharFormat((QTextCharFormat *)local_68);
  if ((this->m_spanFormatStack).super_QList<QTextCharFormat>.d.size != 0) {
    iVar4 = QList<QTextCharFormat>::end(&(this->m_spanFormatStack).super_QList<QTextCharFormat>);
    QTextFormat::operator=((QTextFormat *)local_68,&iVar4.i[-1].super_QTextFormat);
  }
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextBlockFormat::QTextBlockFormat((QTextBlockFormat *)local_78);
  this_00 = &this->m_listStack;
  if ((((this->m_listStack).super_QList<QPointer<QTextList>_>.d.size != 0) &&
      (this->m_needsInsertList == false)) && (this->m_listItem == true)) {
    iVar5 = QList<QPointer<QTextList>_>::end(&this_00->super_QList<QPointer<QTextList>_>);
    pDVar1 = iVar5.i[-1].wp.d;
    if (((pDVar1 == (Data *)0x0) ||
        ((pDVar1->strongref)._q_value.super___atomic_base<int>._M_i == 0)) ||
       (pQVar8 = iVar5.i[-1].wp.value, pQVar8 == (QObject *)0x0)) {
      insertBlock();
    }
    else {
      QTextList::count((QTextList *)pQVar8);
      QTextList::item((QTextList *)&local_90,(int)pQVar8);
      QTextBlock::blockFormat((QTextBlock *)&local_50);
      QTextFormat::operator=((QTextFormat *)local_78,(QTextFormat *)&local_50);
      QTextFormat::~QTextFormat((QTextFormat *)&local_50);
    }
  }
  if (this->m_blockQuoteDepth != 0) {
    ::QVariant::QVariant((QVariant *)&local_50,this->m_blockQuoteDepth);
    QTextFormat::setProperty((QTextFormat *)local_78,0x1080,(QVariant *)&local_50);
    ::QVariant::~QVariant((QVariant *)&local_50);
    ::QVariant::QVariant((QVariant *)&local_50,(double)(this->m_blockQuoteDepth * 0x28));
    QTextFormat::setProperty((QTextFormat *)local_78,0x1032,(QVariant *)&local_50);
    ::QVariant::~QVariant((QVariant *)&local_50);
    ::QVariant::QVariant((QVariant *)&local_50,40.0);
    QTextFormat::setProperty((QTextFormat *)local_78,0x1033,(QVariant *)&local_50);
    ::QVariant::~QVariant((QVariant *)&local_50);
  }
  if (this->m_codeBlock == true) {
    ::QVariant::QVariant((QVariant *)&local_50,(QString *)&this->m_blockCodeLanguage);
    QTextFormat::setProperty((QTextFormat *)local_78,0x1090,(QVariant *)&local_50);
    ::QVariant::~QVariant((QVariant *)&local_50);
    if (this->m_blockCodeFence != '\0') {
      ::QVariant::QVariant((QVariant *)&local_50,true);
      QTextFormat::setProperty((QTextFormat *)local_78,0x1050,(QVariant *)&local_50);
      ::QVariant::~QVariant((QVariant *)&local_50);
      QVar6.ucs._1_1_ = 0;
      QVar6.ucs._0_1_ = this->m_blockCodeFence;
      QString::QString(&local_90,QVar6);
      ::QVariant::QVariant((QVariant *)&local_50,(QString *)&local_90);
      QTextFormat::setProperty((QTextFormat *)local_78,0x1091,(QVariant *)&local_50);
      ::QVariant::~QVariant((QVariant *)&local_50);
      if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    QTextCharFormat::setFont((QTextCharFormat *)local_68,&this->m_monoFont,FontPropertiesAll);
  }
  else {
    ::QVariant::QVariant((QVariant *)&local_50,(double)this->m_paragraphMargin);
    QTextFormat::setProperty((QTextFormat *)local_78,0x1030,(QVariant *)&local_50);
    ::QVariant::~QVariant((QVariant *)&local_50);
    ::QVariant::QVariant((QVariant *)&local_50,(double)this->m_paragraphMargin);
    QTextFormat::setProperty((QTextFormat *)local_78,0x1031,(QVariant *)&local_50);
    ::QVariant::~QVariant((QVariant *)&local_50);
  }
  if (this->m_markerType == NoMarker) {
    QTextFormat::clearProperty((QTextFormat *)local_78,0x10a0);
  }
  else {
    ::QVariant::QVariant((QVariant *)&local_50,this->m_markerType);
    QTextFormat::setProperty((QTextFormat *)local_78,0x10a0,(QVariant *)&local_50);
    ::QVariant::~QVariant((QVariant *)&local_50);
  }
  lVar2 = (this->m_listStack).super_QList<QPointer<QTextList>_>.d.size;
  if (lVar2 != 0) {
    ::QVariant::QVariant((QVariant *)&local_50,(int)lVar2);
    QTextFormat::setProperty((QTextFormat *)local_78,0x1040,(QVariant *)&local_50);
    ::QVariant::~QVariant((QVariant *)&local_50);
  }
  this_01 = QTextCursor::document(&this->m_cursor);
  bVar3 = QTextDocument::isEmpty(this_01);
  if (bVar3) {
    QTextCursor::setBlockFormat(&this->m_cursor,(QTextBlockFormat *)local_78);
  }
  else {
    if (this->m_listItem != true) {
      QTextCursor::insertBlock
                (&this->m_cursor,(QTextBlockFormat *)local_78,(QTextCharFormat *)local_68);
      goto LAB_005c4f98;
    }
    QTextCharFormat::QTextCharFormat((QTextCharFormat *)&local_50);
    QTextCursor::insertBlock
              (&this->m_cursor,(QTextBlockFormat *)local_78,(QTextCharFormat *)&local_50);
    QTextFormat::~QTextFormat((QTextFormat *)&local_50);
  }
  QTextCursor::setCharFormat(&this->m_cursor,(QTextCharFormat *)local_68);
LAB_005c4f98:
  if (this->m_needsInsertList == true) {
    local_50._8_8_ = QTextCursor::createList(&this->m_cursor,&this->m_listFormat);
    if ((QObject *)local_50._8_8_ == (QObject *)0x0) {
      local_50.shared = (PrivateShared *)0x0;
    }
    else {
      local_50.shared =
           (PrivateShared *)QtSharedPointer::ExternalRefCountData::getAndRef(local_50._8_8_);
    }
    QtPrivate::QMovableArrayOps<QPointer<QTextList>>::emplace<QPointer<QTextList>const&>
              ((QMovableArrayOps<QPointer<QTextList>> *)this_00,
               (this->m_listStack).super_QList<QPointer<QTextList>_>.d.size,
               (QPointer<QTextList> *)&local_50);
    QList<QPointer<QTextList>_>::end(&this_00->super_QList<QPointer<QTextList>_>);
    if (local_50.shared != (PrivateShared *)0x0) {
      LOCK();
      *(int *)local_50.shared = *(int *)local_50.shared + -1;
      UNLOCK();
      if (*(int *)local_50.shared == 0) {
        uVar7 = local_50.shared;
        if (local_50.shared == (PrivateShared *)0x0) {
          uVar7 = (PrivateShared *)0x0;
        }
        operator_delete((void *)uVar7);
      }
    }
  }
  else if (((this->m_listStack).super_QList<QPointer<QTextList>_>.d.size != 0) &&
          (this->m_listItem == true)) {
    iVar5 = QList<QPointer<QTextList>_>::end(&this_00->super_QList<QPointer<QTextList>_>);
    pDVar1 = iVar5.i[-1].wp.d;
    if ((pDVar1 != (Data *)0x0) &&
       (((pDVar1->strongref)._q_value.super___atomic_base<int>._M_i != 0 &&
        (iVar5.i[-1].wp.value != (QObject *)0x0)))) {
      iVar5 = QList<QPointer<QTextList>_>::end(&this_00->super_QList<QPointer<QTextList>_>);
      pDVar1 = iVar5.i[-1].wp.d;
      if ((pDVar1 == (Data *)0x0) ||
         ((pDVar1->strongref)._q_value.super___atomic_base<int>._M_i == 0)) {
        pQVar8 = (QObject *)0x0;
      }
      else {
        pQVar8 = iVar5.i[-1].wp.value;
      }
      QTextCursor::block((QTextCursor *)&local_50.shared);
      QTextList::add((QTextList *)pQVar8,(QTextBlock *)&local_50);
    }
  }
  this->m_needsInsertBlock = false;
  this->m_needsInsertList = false;
  QTextFormat::~QTextFormat((QTextFormat *)local_78);
  QTextFormat::~QTextFormat((QTextFormat *)local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextMarkdownImporter::insertBlock()
{
    QTextCharFormat charFormat;
    if (!m_spanFormatStack.isEmpty())
        charFormat = m_spanFormatStack.top();
    QTextBlockFormat blockFormat;
    if (!m_listStack.isEmpty() && !m_needsInsertList && m_listItem) {
        QTextList *list = m_listStack.top();
        if (list)
            blockFormat = list->item(list->count() - 1).blockFormat();
        else
            qWarning() << "attempted to insert into a list that no longer exists";
    }
    if (m_blockQuoteDepth) {
        blockFormat.setProperty(QTextFormat::BlockQuoteLevel, m_blockQuoteDepth);
        blockFormat.setLeftMargin(qtmi_BlockQuoteIndent * m_blockQuoteDepth);
        blockFormat.setRightMargin(qtmi_BlockQuoteIndent);
    }
    if (m_codeBlock) {
        blockFormat.setProperty(QTextFormat::BlockCodeLanguage, m_blockCodeLanguage);
        if (m_blockCodeFence) {
            blockFormat.setNonBreakableLines(true);
            blockFormat.setProperty(QTextFormat::BlockCodeFence, QString(QLatin1Char(m_blockCodeFence)));
        }
        charFormat.setFont(m_monoFont);
    } else {
        blockFormat.setTopMargin(m_paragraphMargin);
        blockFormat.setBottomMargin(m_paragraphMargin);
    }
    if (m_markerType == QTextBlockFormat::MarkerType::NoMarker)
        blockFormat.clearProperty(QTextFormat::BlockMarker);
    else
        blockFormat.setMarker(m_markerType);
    if (!m_listStack.isEmpty())
        blockFormat.setIndent(m_listStack.size());
    if (m_cursor.document()->isEmpty()) {
        m_cursor.setBlockFormat(blockFormat);
        m_cursor.setCharFormat(charFormat);
    } else if (m_listItem) {
        m_cursor.insertBlock(blockFormat, QTextCharFormat());
        m_cursor.setCharFormat(charFormat);
    } else {
        m_cursor.insertBlock(blockFormat, charFormat);
    }
    if (m_needsInsertList) {
        m_listStack.push(m_cursor.createList(m_listFormat));
    } else if (!m_listStack.isEmpty() && m_listItem && m_listStack.top()) {
        m_listStack.top()->add(m_cursor.block());
    }
    m_needsInsertList = false;
    m_needsInsertBlock = false;
}